

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O1

Own<capnp::compiler::BrandScope,_std::nullptr_t> __thiscall
capnp::compiler::BrandScope::evaluateBrand
          (BrandScope *this,Resolver *resolver,ResolvedDecl *decl,Reader brand,uint index)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  BrandScope *pBVar7;
  Reader type;
  Reader brand_00;
  short sVar8;
  Refcounted *refcounted_1;
  _func_int **pp_Var9;
  Disposer *pDVar10;
  void *pvVar11;
  undefined4 in_register_0000000c;
  uint64_t *puVar12;
  uint64_t uVar13;
  CapTableReader *pCVar14;
  undefined1 uVar15;
  WirePointer *pWVar16;
  BrandScope *extraout_RDX;
  BrandScope *extraout_RDX_00;
  BrandScope *pBVar17;
  SegmentReader *pSVar18;
  uint in_R8D;
  ElementCount index_00;
  Refcounted *refcounted;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> OVar19;
  ArrayPtr<capnp::compiler::BrandedDecl> content;
  ArrayBuilder<capnp::compiler::BrandedDecl> params;
  Reader nextScope;
  ResolvedDecl anyPointerDecl;
  Reader binding;
  Reader bindings;
  Disposer *pDStack_2d0;
  StructReader local_298;
  BrandedDecl local_268;
  undefined1 local_1c0 [39];
  undefined8 local_199;
  undefined8 uStack_191;
  StructReader local_188;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ListReader local_128;
  BrandedDecl *local_f8;
  BrandedDecl *pBStack_f0;
  undefined8 local_e8;
  byte local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  StructReader local_90;
  uint local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  puVar12 = (uint64_t *)CONCAT44(in_register_0000000c,index);
  pp_Var1 = resolver[2]._vptr_Resolver;
  pp_Var9 = (_func_int **)operator_new(0x50);
  p_Var2 = (_func_int *)*puVar12;
  *pp_Var9 = (_func_int *)&PTR_disposeImpl_007021d0;
  pp_Var9[2] = (_func_int *)pp_Var1;
  pp_Var9[3] = (_func_int *)0x0;
  pp_Var9[4] = (_func_int *)0x0;
  pp_Var9[5] = p_Var2;
  *(undefined4 *)(pp_Var9 + 6) = 0;
  *(undefined1 *)((long)pp_Var9 + 0x34) = 0;
  pp_Var9[7] = (_func_int *)0x0;
  pp_Var9[8] = (_func_int *)0x0;
  pp_Var9[9] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var9 + 1) = 1;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Var9;
  *(_func_int ***)&(this->super_Refcounted).refcount = pp_Var9;
  *(int *)(pp_Var9 + 6) = (int)puVar12[1];
  if (in_R8D < brand.reader.elementCount) {
    capnp::_::ListReader::getStructElement(&local_298,&brand.reader,in_R8D);
    if (local_298.dataSize < 0x40) {
      uVar13 = 0;
    }
    else {
      uVar13 = *(uint64_t *)CONCAT17(local_298.data._7_1_,local_298.data._0_7_);
    }
    if (*puVar12 == uVar13) {
      if (local_298.dataSize < 0x50) {
        sVar8 = 0;
      }
      else {
        sVar8 = *(short *)(CONCAT17(local_298.data._7_1_,local_298.data._0_7_) + 8);
      }
      if (sVar8 == 0) {
        if (local_298.pointerCount == 0) {
          local_298.nestingLimit = 0x7fffffff;
          local_268.body.field_1._0_8_ = 0;
          local_268.body.field_1._8_8_ = 0;
          local_268.body.tag = 0;
          local_268.body._4_4_ = 0;
        }
        else {
          local_268.body._7_1_ = local_298.segment._7_1_;
          local_268.body._0_7_ = local_298.segment._0_7_;
          local_268.body.field_1._0_8_ = CONCAT17(local_298.capTable._7_1_,local_298.capTable._0_7_)
          ;
          local_268.body.field_1._8_8_ = CONCAT17(local_298.pointers._7_1_,local_298.pointers._0_7_)
          ;
        }
        local_268.body.field_1._16_4_ = local_298.nestingLimit;
        capnp::_::PointerReader::getList
                  (&local_128,(PointerReader *)&local_268,INLINE_COMPOSITE,(word *)0x0);
        pDVar10 = (Disposer *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (0xa8,0,(ulong)local_128.elementCount,(_func_void_void_ptr *)0x0,
                             (_func_void_void_ptr *)0x0);
        pDStack_2d0 = pDVar10;
        if (local_128.elementCount != 0) {
          index_00 = 0;
          do {
            capnp::_::ListReader::getStructElement(&local_188,&local_128,index_00);
            if (local_188.dataSize < 0x10) {
              sVar8 = 0;
            }
            else {
              sVar8 = *local_188.data;
            }
            if (sVar8 == 0) {
              (**(code **)(decl->id + 0x10))(&local_268,decl,0x1e);
              uVar15 = local_268.body.field_1.space[0x20];
              if (local_268.body.field_1.space[0x20] == '\x01') {
                local_158 = CONCAT44(local_268.body.field_1._44_4_,local_268.body.field_1._40_4_);
                local_138 = local_268.body.field_1._72_8_;
                uStack_130 = local_268.body.field_1._80_8_;
                local_148 = local_268.body.field_1._56_8_;
                uStack_140 = local_268.body.field_1._64_8_;
                uStack_150 = local_268.body.field_1._48_8_;
              }
              pp_Var1 = resolver[2]._vptr_Resolver;
              pvVar11 = operator_new(0x50);
              *(undefined ***)pvVar11 = &PTR_disposeImpl_007021d0;
              *(_func_int ***)((long)pvVar11 + 0x10) = pp_Var1;
              *(undefined8 *)((long)pvVar11 + 0x18) = 0;
              *(undefined8 *)((long)pvVar11 + 0x20) = 0;
              *(undefined8 *)((long)pvVar11 + 0x28) = local_268.body.field_1._8_8_;
              *(undefined4 *)((long)pvVar11 + 0x30) = 0;
              *(undefined1 *)((long)pvVar11 + 0x34) = 0;
              *(undefined8 *)((long)pvVar11 + 0x38) = 0;
              *(undefined8 *)((long)pvVar11 + 0x40) = 0;
              *(undefined8 *)((long)pvVar11 + 0x48) = 0;
              *(undefined4 *)((long)pvVar11 + 8) = 1;
              local_38 = local_268.body.field_1._24_8_;
              uStack_40 = CONCAT44(local_268.body.field_1._20_4_,local_268.body.field_1._16_4_);
              local_48 = local_268.body.field_1._8_8_;
              local_58 = local_268.body.tag;
              uStack_54 = local_268.body._4_4_;
              uStack_50 = local_268.body.field_1._0_8_;
              if (uVar15 != '\0') {
                local_199 = local_138;
                uStack_191 = uStack_130;
                local_1c0[0x17] = (undefined1)local_148;
                local_1c0._24_4_ = (undefined4)((ulong)local_148 >> 8);
                local_1c0._28_3_ = (undefined3)((ulong)local_148 >> 0x28);
                local_1c0._31_8_ = uStack_140;
                local_1c0[7] = (undefined1)local_158;
                local_1c0._8_7_ = (undefined7)((ulong)local_158 >> 8);
                local_1c0[0xf] = (undefined1)uStack_150;
                local_1c0._16_7_ = (undefined7)((ulong)uStack_150 >> 8);
              }
              *(undefined4 *)&pDStack_2d0->_vptr_Disposer = 1;
              pDStack_2d0[1] = (Disposer)local_268.body._0_8_;
              pDStack_2d0[2] = (Disposer)local_268.body.field_1._0_8_;
              pDStack_2d0[3] = (Disposer)local_268.body.field_1._8_8_;
              pDStack_2d0[4] = (Disposer)uStack_40;
              pDStack_2d0[5] = (Disposer)local_268.body.field_1._24_8_;
              *(undefined1 *)(pDStack_2d0 + 6) = uVar15;
              if (uVar15 != '\0') {
                pDStack_2d0[0xb] = (Disposer)local_199;
                pDStack_2d0[0xc] = (Disposer)uStack_191;
                pDStack_2d0[9] =
                     (Disposer)CONCAT35(local_1c0._28_3_,CONCAT41(local_1c0._24_4_,local_1c0[0x17]))
                ;
                pDStack_2d0[10] = (Disposer)local_1c0._31_8_;
                pDStack_2d0[7] = (Disposer)CONCAT71(local_1c0._8_7_,local_1c0[7]);
                pDStack_2d0[8] = (Disposer)CONCAT71(local_1c0._16_7_,local_1c0[0xf]);
              }
              pDStack_2d0[0xd] = (Disposer)pvVar11;
              pDStack_2d0[0xe] = (Disposer)pvVar11;
              pDStack_2d0[0xf] = (_func_int **)0x0;
              pDStack_2d0[0x10] = (_func_int **)0x0;
              pDStack_2d0[0x11] = (_func_int **)0x0;
              pDStack_2d0[0x12] = (_func_int **)0x0;
              pDStack_2d0[0x13] = (_func_int **)0x0;
              pDStack_2d0[0x14] = (_func_int **)0x7fffffff;
              pDStack_2d0 = pDStack_2d0 + 0x15;
            }
            else if (sVar8 == 1) {
              pCVar14 = local_188.capTable;
              pWVar16 = local_188.pointers;
              pSVar18 = local_188.segment;
              local_1c0._24_4_ = local_188.nestingLimit;
              if (local_188.pointerCount == 0) {
                pCVar14 = (CapTableReader *)0x0;
                pWVar16 = (WirePointer *)0x0;
                pSVar18 = (SegmentReader *)0x0;
                local_1c0._24_4_ = 0x7fffffff;
              }
              local_1c0._0_7_ = SUB87(pSVar18,0);
              local_1c0[7] = (undefined1)((ulong)pSVar18 >> 0x38);
              local_1c0._8_7_ = SUB87(pCVar14,0);
              local_1c0[0xf] = (undefined1)((ulong)pCVar14 >> 0x38);
              local_1c0._16_7_ = SUB87(pWVar16,0);
              local_1c0[0x17] = (undefined1)((ulong)pWVar16 >> 0x38);
              capnp::_::PointerReader::getStruct(&local_90,(PointerReader *)local_1c0,(word *)0x0);
              type._reader.capTable = local_90.capTable;
              type._reader.segment = local_90.segment;
              type._reader.data = local_90.data;
              type._reader.pointers = local_90.pointers;
              type._reader.dataSize = local_90.dataSize;
              type._reader.pointerCount = local_90.pointerCount;
              type._reader._38_2_ = local_90._38_2_;
              type._reader.nestingLimit = local_90.nestingLimit;
              type._reader._44_4_ = local_90._44_4_;
              decompileType(&local_268,(BrandScope *)resolver,(Resolver *)decl,type);
              *(uint *)&pDStack_2d0->_vptr_Disposer = local_268.body.tag;
              if (local_268.body.tag == 2) {
                pDStack_2d0[1] = (Disposer)local_268.body.field_1._0_8_;
                pDStack_2d0[2] = (Disposer)local_268.body.field_1._8_8_;
              }
              else if (local_268.body.tag == 1) {
                pDStack_2d0[5] =
                     (Disposer)
                     CONCAT71(local_268.body.field_1._33_7_,local_268.body.field_1.space[0x20]);
                pDStack_2d0[3] =
                     (Disposer)CONCAT44(local_268.body.field_1._20_4_,local_268.body.field_1._16_4_)
                ;
                pDStack_2d0[4] = (Disposer)local_268.body.field_1._24_8_;
                pDStack_2d0[1] = (Disposer)local_268.body.field_1._0_8_;
                pDStack_2d0[2] = (Disposer)local_268.body.field_1._8_8_;
                *(byte *)(pDStack_2d0 + 6) = local_268.body.field_1.space[0x28];
                if (local_268.body.field_1.space[0x28] == '\x01') {
                  pDStack_2d0[0xb] = (Disposer)local_268.body.field_1._80_8_;
                  pDStack_2d0[0xc] = (Disposer)local_268.body.field_1._88_8_;
                  pDStack_2d0[9] = (Disposer)local_268.body.field_1._64_8_;
                  pDStack_2d0[10] = (Disposer)local_268.body.field_1._72_8_;
                  pDStack_2d0[7] = (Disposer)local_268.body.field_1._48_8_;
                  pDStack_2d0[8] = (Disposer)local_268.body.field_1._56_8_;
                }
                uVar15 = local_268.body.field_1.space[0x28];
                if (local_268.body.field_1.space[0x28] != '\0') {
                  uVar15 = '\0';
                }
                local_268.body.field_1.space[0x28] = uVar15;
              }
              pDStack_2d0[0xd] = (Disposer)local_268.brand.disposer;
              pDStack_2d0[0xe] = (Disposer)local_268.brand.ptr;
              local_268.brand.ptr = (BrandScope *)0x0;
              pDStack_2d0[0x13] = (Disposer)local_268.source._reader._32_8_;
              pDStack_2d0[0x14] = (Disposer)local_268.source._reader._40_8_;
              pDStack_2d0[0x11] = (Disposer)local_268.source._reader.data;
              pDStack_2d0[0x12] = (Disposer)local_268.source._reader.pointers;
              pDStack_2d0[0xf] = (Disposer)local_268.source._reader.segment;
              pDStack_2d0[0x10] = (Disposer)local_268.source._reader.capTable;
              pDStack_2d0 = pDStack_2d0 + 0x15;
            }
            index_00 = index_00 + 1;
          } while (local_128.elementCount != index_00);
        }
        local_268.body.field_1._0_8_ =
             ((long)pDStack_2d0 - (long)pDVar10 >> 3) * -0x30c30c30c30c30c3;
        local_268.body.field_1._8_8_ = &kj::_::HeapArrayDisposer::instance;
        lVar4 = *(long *)&(this->super_Refcounted).refcount;
        lVar5 = *(long *)(lVar4 + 0x38);
        local_268.body._0_8_ = pDVar10;
        if (lVar5 != 0) {
          uVar6 = *(undefined8 *)(lVar4 + 0x40);
          *(undefined8 *)(lVar4 + 0x38) = 0;
          *(undefined8 *)(lVar4 + 0x40) = 0;
          (**(code **)**(undefined8 **)(lVar4 + 0x48))
                    (*(undefined8 **)(lVar4 + 0x48),lVar5,0xa8,uVar6,uVar6,
                     kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
        }
        *(undefined8 *)(lVar4 + 0x38) = local_268.body._0_8_;
        *(undefined8 *)(lVar4 + 0x40) = local_268.body.field_1._0_8_;
        *(undefined8 *)(lVar4 + 0x48) = local_268.body.field_1._8_8_;
      }
      else if (sVar8 == 1) {
        getParams((Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *)&local_268,
                  (BrandScope *)resolver,*puVar12);
        if ((char)local_268.body.tag == '\x01') {
          content.size_ = uVar13;
          content.ptr = (BrandedDecl *)local_268.body.field_1._8_8_;
          kj::heapArray<capnp::compiler::BrandedDecl>
                    ((Array<capnp::compiler::BrandedDecl> *)&local_268,
                     (kj *)local_268.body.field_1._0_8_,content);
          p_Var2 = pp_Var9[7];
          if (p_Var2 != (_func_int *)0x0) {
            p_Var3 = pp_Var9[8];
            pp_Var9[7] = (_func_int *)0x0;
            pp_Var9[8] = (_func_int *)0x0;
            (*(code *)**(undefined8 **)pp_Var9[9])
                      (pp_Var9[9],p_Var2,0xa8,p_Var3,p_Var3,
                       kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
          }
          pp_Var9[7] = (_func_int *)local_268.body._0_8_;
          pp_Var9[8] = (_func_int *)local_268.body.field_1._0_8_;
          pp_Var9[9] = (_func_int *)local_268.body.field_1._8_8_;
        }
        else {
          *(undefined1 *)((long)pp_Var9 + 0x34) = 1;
        }
      }
    }
  }
  (**(code **)(*(long *)puVar12[4] + 0x20))(&local_268);
  pBVar17 = extraout_RDX;
  if ((char)local_268.body.tag == '\x01') {
    local_298.data._7_1_ = (undefined1)local_268.body.field_1._16_4_;
    local_298.pointers._0_7_ =
         (undefined7)(CONCAT44(local_268.body.field_1._20_4_,local_268.body.field_1._16_4_) >> 8);
    local_298.pointers._7_1_ = (undefined1)local_268.body.field_1._24_8_;
    local_298.dataSize = (StructDataBitCount)((ulong)local_268.body.field_1._24_8_ >> 8);
    local_298.pointerCount = (StructPointerCount)((ulong)local_268.body.field_1._24_8_ >> 0x28);
    local_298._38_1_ = SUB81((ulong)local_268.body.field_1._24_8_ >> 0x38,0);
    local_298.segment._7_1_ = (undefined1)local_268.body.field_1._0_8_;
    local_298.capTable._0_7_ = (undefined7)((ulong)local_268.body.field_1._0_8_ >> 8);
    local_298.capTable._7_1_ = (undefined1)local_268.body.field_1._8_8_;
    local_298.data._0_7_ = (undefined7)((ulong)local_268.body.field_1._8_8_ >> 8);
    local_d0 = local_268.body.field_1.space[0x28];
    if (local_268.body.field_1.space[0x28] == '\x01') {
      local_199 = local_268.body.field_1._80_8_;
      uStack_191 = local_268.body.field_1._88_8_;
      local_1c0[0x17] = (undefined1)local_268.body.field_1._64_8_;
      local_1c0._24_4_ = (undefined4)((ulong)local_268.body.field_1._64_8_ >> 8);
      local_1c0._28_3_ = (undefined3)((ulong)local_268.body.field_1._64_8_ >> 0x28);
      local_1c0._31_8_ = local_268.body.field_1._72_8_;
      local_1c0[7] = (undefined1)local_268.body.field_1._48_8_;
      local_1c0._8_7_ = (undefined7)((ulong)local_268.body.field_1._48_8_ >> 8);
      local_1c0[0xf] = (undefined1)local_268.body.field_1._56_8_;
      local_1c0._16_7_ = (undefined7)((ulong)local_268.body.field_1._56_8_ >> 8);
      local_268.body.field_1._40_4_ = local_268.body.field_1._40_4_ & 0xffffff00;
    }
    local_f8 = (BrandedDecl *)local_268.body.field_1._0_8_;
    pBStack_f0 = (BrandedDecl *)local_268.body.field_1._8_8_;
    local_e8 = CONCAT71(local_298.pointers._0_7_,local_298.data._7_1_);
    if (local_d0 != '\0') {
      local_c8 = CONCAT71(local_1c0._8_7_,local_1c0[7]);
      uStack_c0 = CONCAT71(local_1c0._16_7_,local_1c0[0xf]);
      local_b8 = CONCAT35(local_1c0._28_3_,CONCAT41(local_1c0._24_4_,local_1c0[0x17]));
      local_a8 = local_199;
      uStack_a0 = uStack_191;
      uStack_b0 = local_1c0._31_8_;
    }
    brand_00.reader.step = brand.reader.step;
    brand_00.reader.elementCount = brand.reader.elementCount;
    brand_00.reader.capTable = brand.reader.capTable;
    brand_00.reader.segment = brand.reader.segment;
    brand_00.reader.ptr = brand.reader.ptr;
    brand_00.reader.structDataSize = brand.reader.structDataSize;
    brand_00.reader.structPointerCount = brand.reader.structPointerCount;
    brand_00.reader.elementSize = brand.reader.elementSize;
    brand_00.reader._39_1_ = brand.reader._39_1_;
    brand_00.reader.nestingLimit = brand.reader.nestingLimit;
    brand_00.reader._44_4_ = brand.reader._44_4_;
    evaluateBrand((BrandScope *)&local_268,resolver,decl,brand_00,(uint)&local_f8);
    uVar6 = local_268.body.field_1._0_8_;
    local_268.body.field_1._0_8_ = 0;
    pBVar17 = *(BrandScope **)&(this->super_Refcounted).refcount;
    pDVar10 = (pBVar17->parent).ptr.disposer;
    pBVar7 = (pBVar17->parent).ptr.ptr;
    (pBVar17->parent).ptr.disposer = (Disposer *)local_268.body._0_8_;
    (pBVar17->parent).ptr.ptr = (BrandScope *)uVar6;
    if (pBVar7 != (BrandScope *)0x0) {
      (**pDVar10->_vptr_Disposer)
                (pDVar10,(_func_int *)
                         ((long)&(pBVar7->super_Refcounted).super_Disposer._vptr_Disposer +
                         (long)(pBVar7->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
      pBVar17 = extraout_RDX_00;
    }
  }
  OVar19.ptr = pBVar17;
  OVar19.disposer = (Disposer *)this;
  return OVar19;
}

Assistant:

kj::Own<BrandScope> BrandScope::evaluateBrand(
    Resolver& resolver, Resolver::ResolvedDecl decl,
    List<schema::Brand::Scope>::Reader brand, uint index) {
  auto result = kj::refcounted<BrandScope>(errorReporter, decl.id);
  result->leafParamCount = decl.genericParamCount;

  // Fill in `params`.
  if (index < brand.size()) {
    auto nextScope = brand[index];
    if (decl.id == nextScope.getScopeId()) {
      // Initialize our parameters.

      switch (nextScope.which()) {
        case schema::Brand::Scope::BIND: {
          auto bindings = nextScope.getBind();
          auto params = kj::heapArrayBuilder<BrandedDecl>(bindings.size());
          for (auto binding: bindings) {
            switch (binding.which()) {
              case schema::Brand::Binding::UNBOUND: {
                // Build an AnyPointer-equivalent.
                auto anyPointerDecl = resolver.resolveBuiltin(Declaration::BUILTIN_ANY_POINTER);
                params.add(BrandedDecl(anyPointerDecl,
                    kj::refcounted<BrandScope>(errorReporter, anyPointerDecl.scopeId),
                    Expression::Reader()));
                break;
              }

              case schema::Brand::Binding::TYPE:
                // Reverse this schema::Type back into a BrandedDecl.
                params.add(decompileType(resolver, binding.getType()));
                break;
            }
          }
          result->params = params.finish();
          break;
        }

        case schema::Brand::Scope::INHERIT:
          KJ_IF_SOME(p, getParams(decl.id)) {
            result->params = kj::heapArray(p);
          } else {
            result->inherited = true;
          }
          break;
      }

      // Parent should start one level deeper in the list.
      ++index;
    }
  }